

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkTimeInitialize(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkOld)

{
  void **ppvVar1;
  Abc_Time_t *pAVar2;
  Abc_ManTime_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Time_t *pAVar5;
  long lVar6;
  
  if (pNtkOld != (Abc_Ntk_t *)0x0) {
    if (pNtkOld->pManTime == (Abc_ManTime_t *)0x0) {
      __assert_fail("pNtkOld == NULL || pNtkOld->pManTime != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x156,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtk->vCis->nSize != pNtkOld->vCis->nSize) {
      __assert_fail("pNtkOld == NULL || Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x157,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtk->vCos->nSize != pNtkOld->vCos->nSize) {
      __assert_fail("pNtkOld == NULL || Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x158,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
  }
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    Abc_ManTimeExpand(pNtk->pManTime,pNtk->vObjs->nSize,0);
    if (pNtkOld != (Abc_Ntk_t *)0x0) {
      pNtk->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
      pNtk->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
      pNtk->AndGateDelay = pNtkOld->AndGateDelay;
    }
    pVVar4 = pNtk->vCis;
    if (0 < pVVar4->nSize) {
      ppvVar1 = pNtk->pManTime->vArrs->pArray;
      lVar6 = 0;
      do {
        pAVar2 = (Abc_Time_t *)ppvVar1[*(int *)((long)pVVar4->pArray[lVar6] + 0x10)];
        if (pNtkOld == (Abc_Ntk_t *)0x0) {
          pAVar3 = pNtk->pManTime;
        }
        else {
          if (pNtkOld->vCis->nSize <= lVar6) goto LAB_00319776;
          pAVar3 = (Abc_ManTime_t *)Abc_NodeReadArrival((Abc_Obj_t *)pNtkOld->vCis->pArray[lVar6]);
        }
        *pAVar2 = pAVar3->tArrDef;
        lVar6 = lVar6 + 1;
        pVVar4 = pNtk->vCis;
      } while (lVar6 < pVVar4->nSize);
    }
    pVVar4 = pNtk->vCos;
    if (0 < pVVar4->nSize) {
      ppvVar1 = pNtk->pManTime->vReqs->pArray;
      lVar6 = 0;
      do {
        pAVar2 = (Abc_Time_t *)ppvVar1[*(int *)((long)pVVar4->pArray[lVar6] + 0x10)];
        if (pNtkOld == (Abc_Ntk_t *)0x0) {
          pAVar5 = &pNtk->pManTime->tReqDef;
        }
        else {
          if (pNtkOld->vCos->nSize <= lVar6) {
LAB_00319776:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar5 = Abc_NodeReadRequired((Abc_Obj_t *)pNtkOld->vCos->pArray[lVar6]);
        }
        *pAVar2 = *pAVar5;
        lVar6 = lVar6 + 1;
        pVVar4 = pNtk->vCos;
      } while (lVar6 < pVVar4->nSize);
    }
  }
  return;
}

Assistant:

void Abc_NtkTimeInitialize( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkOld )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes;
    int i;
    assert( pNtkOld == NULL || pNtkOld->pManTime != NULL );
    assert( pNtkOld == NULL || Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkOld) );
    assert( pNtkOld == NULL || Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkOld) );
    if ( pNtk->pManTime == NULL )
        return;
    // create timing manager with default values
    Abc_ManTimeExpand( pNtk->pManTime, Abc_NtkObjNumMax(pNtk), 0 );
    // set global defaults from pNtkOld
    if ( pNtkOld )
    {
        pNtk->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
        pNtk->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
        pNtk->AndGateDelay = pNtkOld->AndGateDelay;
    }
    // set the default timing for CI and COs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtk, pObj, i )
        *ppTimes[pObj->Id] = pNtkOld ? *Abc_NodeReadArrival(Abc_NtkCi(pNtkOld, i)) : pNtk->pManTime->tArrDef;
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtk, pObj, i )
        *ppTimes[pObj->Id] = pNtkOld ? *Abc_NodeReadRequired(Abc_NtkCo(pNtkOld, i)) : pNtk->pManTime->tReqDef;
}